

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_decompress.c
# Opt level: O3

libdeflate_result
libdeflate_zlib_decompress_ex
          (libdeflate_decompressor *d,void *in,size_t in_nbytes,void *out,size_t out_nbytes_avail,
          size_t *actual_in_nbytes_ret,size_t *actual_out_nbytes_ret)

{
  void *in_00;
  ushort uVar1;
  uint uVar2;
  libdeflate_result lVar3;
  uint32_t uVar4;
  ushort uVar5;
  uint uVar6;
  size_t actual_in_nbytes;
  size_t local_38;
  
  lVar3 = LIBDEFLATE_BAD_DATA;
  if ((((5 < in_nbytes) && (uVar1 = *in >> 8, uVar5 = *in << 8 | uVar1, (uVar1 & 0x20) == 0)) &&
      (-1 < (short)uVar5)) &&
     ((uVar2 = (uint)uVar5, uVar6 = uVar2 * 0x843 >> 0x10,
      uVar6 = ((uVar2 - uVar6 & 0xffff) >> 1) + uVar6 >> 4,
      (ushort)(((short)uVar6 - (short)(uVar6 << 5)) + uVar5) == 0 && ((uVar2 & 0xf00) == 0x800)))) {
    in_00 = (void *)((long)in + 2);
    lVar3 = libdeflate_deflate_decompress_ex
                      (d,in_00,(long)in + (in_nbytes - (long)in_00) + -4,out,out_nbytes_avail,
                       &local_38,actual_out_nbytes_ret);
    if (lVar3 == LIBDEFLATE_SUCCESS) {
      if (actual_out_nbytes_ret != (size_t *)0x0) {
        out_nbytes_avail = *actual_out_nbytes_ret;
      }
      lVar3 = LIBDEFLATE_BAD_DATA;
      uVar4 = libdeflate_adler32(1,out,out_nbytes_avail);
      uVar2 = *(uint *)((long)in_00 + local_38);
      if ((uVar4 == (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
                    )) && (lVar3 = LIBDEFLATE_SUCCESS, actual_in_nbytes_ret != (size_t *)0x0)) {
        *actual_in_nbytes_ret = (long)in_00 + (local_38 - (long)in) + 4;
      }
    }
  }
  return lVar3;
}

Assistant:

libdeflate_result
libdeflate_zlib_decompress_ex(struct libdeflate_decompressor *d,
			      const void *in, size_t in_nbytes,
			      void *out, size_t out_nbytes_avail,
			      size_t *actual_in_nbytes_ret,
			      size_t *actual_out_nbytes_ret)
{
	const u8 *in_next = in;
	const u8 * const in_end = in_next + in_nbytes;
	u16 hdr;
	size_t actual_in_nbytes;
	size_t actual_out_nbytes;
	enum libdeflate_result result;

	if (in_nbytes < ZLIB_MIN_OVERHEAD)
		return LIBDEFLATE_BAD_DATA;

	/* 2 byte header: CMF and FLG  */
	hdr = get_unaligned_be16(in_next);
	in_next += 2;

	/* FCHECK */
	if ((hdr % 31) != 0)
		return LIBDEFLATE_BAD_DATA;

	/* CM */
	if (((hdr >> 8) & 0xF) != ZLIB_CM_DEFLATE)
		return LIBDEFLATE_BAD_DATA;

	/* CINFO */
	if ((hdr >> 12) > ZLIB_CINFO_32K_WINDOW)
		return LIBDEFLATE_BAD_DATA;

	/* FDICT */
	if ((hdr >> 5) & 1)
		return LIBDEFLATE_BAD_DATA;

	/* Compressed data  */
	result = libdeflate_deflate_decompress_ex(d, in_next,
					in_end - ZLIB_FOOTER_SIZE - in_next,
					out, out_nbytes_avail,
					&actual_in_nbytes, actual_out_nbytes_ret);
	if (result != LIBDEFLATE_SUCCESS)
		return result;

	if (actual_out_nbytes_ret)
		actual_out_nbytes = *actual_out_nbytes_ret;
	else
		actual_out_nbytes = out_nbytes_avail;

	in_next += actual_in_nbytes;

	/* ADLER32  */
	if (libdeflate_adler32(1, out, actual_out_nbytes) !=
	    get_unaligned_be32(in_next))
		return LIBDEFLATE_BAD_DATA;
	in_next += 4;

	if (actual_in_nbytes_ret)
		*actual_in_nbytes_ret = in_next - (u8 *)in;

	return LIBDEFLATE_SUCCESS;
}